

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::AddWithoutInterpreting
          (OptionInterpreter *this,UninterpretedOption *uninterpreted_option,Message *options)

{
  Descriptor *this_00;
  FieldDescriptor *pFVar1;
  LogMessage *other;
  long *plVar2;
  LogFinisher local_9a;
  byte local_99;
  LogMessage local_98;
  allocator<char> local_49;
  string local_48;
  FieldDescriptor *local_28;
  FieldDescriptor *field;
  Message *options_local;
  UninterpretedOption *uninterpreted_option_local;
  OptionInterpreter *this_local;
  
  field = (FieldDescriptor *)options;
  options_local = &uninterpreted_option->super_Message;
  uninterpreted_option_local = (UninterpretedOption *)this;
  this_00 = Message::GetDescriptor(options);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"uninterpreted_option",&local_49);
  pFVar1 = Descriptor::FindFieldByName(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  local_99 = 0;
  local_28 = pFVar1;
  if (pFVar1 == (FieldDescriptor *)0x0) {
    internal::LogMessage::LogMessage
              (&local_98,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
               ,0x118f);
    local_99 = 1;
    other = internal::LogMessage::operator<<(&local_98,"CHECK failed: field != NULL: ");
    internal::LogFinisher::operator=(&local_9a,other);
  }
  if ((local_99 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_98);
  }
  plVar2 = (long *)(**(code **)(*(long *)field + 0x90))();
  plVar2 = (long *)(**(code **)(*plVar2 + 0x208))(plVar2,field,local_28,0);
  (**(code **)(*plVar2 + 0x68))(plVar2,options_local);
  return;
}

Assistant:

void DescriptorBuilder::OptionInterpreter::AddWithoutInterpreting(
    const UninterpretedOption& uninterpreted_option, Message* options) {
  const FieldDescriptor* field =
    options->GetDescriptor()->FindFieldByName("uninterpreted_option");
  GOOGLE_CHECK(field != NULL);

  options->GetReflection()->AddMessage(options, field)
    ->CopyFrom(uninterpreted_option);
}